

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_suite.cpp
# Opt level: O0

void assume_value_suite::get_integer(void)

{
  char *pcVar1;
  uchar *puVar2;
  short *psVar3;
  unsigned_short *puVar4;
  int *piVar5;
  uint *puVar6;
  long *plVar7;
  unsigned_long *puVar8;
  longlong *plVar9;
  unsigned_long_long *puVar10;
  undefined1 local_288 [8];
  variable data_9;
  unsigned_long_long value_9;
  variable data_8;
  longlong value_8;
  variable data_7;
  unsigned_long value_7;
  variable data_6;
  long value_6;
  variable data_5;
  undefined1 local_148 [4];
  uint value_5;
  variable data_4;
  undefined1 local_108 [4];
  int value_4;
  variable data_3;
  undefined1 local_c8 [6];
  unsigned_short value_3;
  variable data_2;
  undefined1 local_88 [6];
  short value_2;
  variable data_1;
  uchar value_1;
  undefined1 local_48 [8];
  variable data;
  char value;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<signed_char>
            ((basic_variable<std::allocator<char>_> *)local_48,'\x02');
  pcVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::assume_value<signed_char>
                     ((basic_variable<std::allocator<char>_> *)local_48);
  boost::detail::test_impl
            ("data.assume_value<signed char>() == value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1327,"void assume_value_suite::get_integer()",*pcVar1 == '\x02');
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_48);
  data_1.storage._43_1_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_char>
            ((basic_variable<std::allocator<char>_> *)local_88,'\x02');
  puVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::assume_value<unsigned_char>
                     ((basic_variable<std::allocator<char>_> *)local_88);
  boost::detail::test_impl
            ("data.assume_value<unsigned char>() == value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x132c,"void assume_value_suite::get_integer()",*puVar2 == '\x02');
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_88);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<short>
            ((basic_variable<std::allocator<char>_> *)local_c8,2);
  psVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::assume_value<short>
                     ((basic_variable<std::allocator<char>_> *)local_c8);
  boost::detail::test_impl
            ("data.assume_value<signed short int>() == value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1331,"void assume_value_suite::get_integer()",*psVar3 == 2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_short>
            ((basic_variable<std::allocator<char>_> *)local_108,2);
  puVar4 = trial::dynamic::basic_variable<std::allocator<char>_>::assume_value<unsigned_short>
                     ((basic_variable<std::allocator<char>_> *)local_108);
  boost::detail::test_impl
            ("data.assume_value<unsigned short int>() == value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1336,"void assume_value_suite::get_integer()",*puVar4 == 2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_108);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_148,2);
  piVar5 = trial::dynamic::basic_variable<std::allocator<char>_>::assume_value<int>
                     ((basic_variable<std::allocator<char>_> *)local_148);
  boost::detail::test_impl
            ("data.assume_value<signed int>() == value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x133b,"void assume_value_suite::get_integer()",*piVar5 == 2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_148);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>
            ((basic_variable<std::allocator<char>_> *)&value_6,2);
  puVar6 = trial::dynamic::basic_variable<std::allocator<char>_>::assume_value<unsigned_int>
                     ((basic_variable<std::allocator<char>_> *)&value_6);
  boost::detail::test_impl
            ("data.assume_value<unsigned int>() == value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1340,"void assume_value_suite::get_integer()",*puVar6 == 2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&value_6);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long>
            ((basic_variable<std::allocator<char>_> *)&value_7,2);
  plVar7 = trial::dynamic::basic_variable<std::allocator<char>_>::assume_value<long>
                     ((basic_variable<std::allocator<char>_> *)&value_7);
  boost::detail::test_impl
            ("data.assume_value<signed long int>() == value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1345,"void assume_value_suite::get_integer()",*plVar7 == 2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&value_7);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_long>
            ((basic_variable<std::allocator<char>_> *)&value_8,2);
  puVar8 = trial::dynamic::basic_variable<std::allocator<char>_>::assume_value<unsigned_long>
                     ((basic_variable<std::allocator<char>_> *)&value_8);
  boost::detail::test_impl
            ("data.assume_value<unsigned long int>() == value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x134a,"void assume_value_suite::get_integer()",*puVar8 == 2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&value_8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_long>
            ((basic_variable<std::allocator<char>_> *)&value_9,2);
  plVar9 = trial::dynamic::basic_variable<std::allocator<char>_>::assume_value<long_long>
                     ((basic_variable<std::allocator<char>_> *)&value_9);
  boost::detail::test_impl
            ("data.assume_value<signed long long int>() == value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x134f,"void assume_value_suite::get_integer()",*plVar9 == 2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&value_9);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_long_long>
            ((basic_variable<std::allocator<char>_> *)local_288,2);
  puVar10 = trial::dynamic::basic_variable<std::allocator<char>_>::assume_value<unsigned_long_long>
                      ((basic_variable<std::allocator<char>_> *)local_288);
  boost::detail::test_impl
            ("data.assume_value<unsigned long long int>() == value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1354,"void assume_value_suite::get_integer()",*puVar10 == 2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_288);
  return;
}

Assistant:

void get_integer()
{
    {
        const signed char value{2};
        variable data(value);
        TRIAL_PROTOCOL_TEST(data.assume_value<signed char>() == value);
    }
    {
        const unsigned char value{2};
        variable data(value);
        TRIAL_PROTOCOL_TEST(data.assume_value<unsigned char>() == value);
    }
    {
        const signed short int value{2};
        variable data(value);
        TRIAL_PROTOCOL_TEST(data.assume_value<signed short int>() == value);
    }
    {
        const unsigned short int value{2};
        variable data(value);
        TRIAL_PROTOCOL_TEST(data.assume_value<unsigned short int>() == value);
    }
    {
        const signed int value{2};
        variable data(value);
        TRIAL_PROTOCOL_TEST(data.assume_value<signed int>() == value);
    }
    {
        const unsigned int value{2};
        variable data(value);
        TRIAL_PROTOCOL_TEST(data.assume_value<unsigned int>() == value);
    }
    {
        const signed long int value{2};
        variable data(value);
        TRIAL_PROTOCOL_TEST(data.assume_value<signed long int>() == value);
    }
    {
        const unsigned long int value{2};
        variable data(value);
        TRIAL_PROTOCOL_TEST(data.assume_value<unsigned long int>() == value);
    }
    {
        const signed long long int value{2};
        variable data(value);
        TRIAL_PROTOCOL_TEST(data.assume_value<signed long long int>() == value);
    }
    {
        const unsigned long long int value{2};
        variable data(value);
        TRIAL_PROTOCOL_TEST(data.assume_value<unsigned long long int>() == value);
    }
}